

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

char * __thiscall
kj::_::Delimited<kj::ArrayPtr<void_*const>_>::flattenTo
          (Delimited<kj::ArrayPtr<void_*const>_> *this,char *target)

{
  size_t sVar1;
  CappedArray<char,_17UL> *pCVar2;
  char *__src;
  size_t sVar3;
  size_t __n;
  bool bVar4;
  long lVar5;
  
  ensureStringifiedInitialized(this);
  sVar1 = (this->stringified).size_;
  if (sVar1 != 0) {
    pCVar2 = (this->stringified).ptr;
    bVar4 = true;
    lVar5 = 0;
    do {
      if (!bVar4) {
        __src = (this->delimiter).content.ptr;
        sVar3 = (this->delimiter).content.size_;
        if (__src != __src + (sVar3 - 1)) {
          memcpy(target,__src,sVar3 - 1);
          target = target + (sVar3 - 1);
        }
      }
      __n = *(size_t *)(pCVar2->content + lVar5 + -8);
      if (__n != 0) {
        memcpy(target,pCVar2->content + lVar5,__n);
        target = target + __n;
      }
      lVar5 = lVar5 + 0x20;
      bVar4 = false;
    } while (sVar1 << 5 != lVar5);
  }
  return target;
}

Assistant:

char* flattenTo(char* __restrict__ target) {
    ensureStringifiedInitialized();

    bool first = true;
    for (auto& elem: stringified) {
      if (first) {
        first = false;
      } else {
        target = fill(target, delimiter);
      }
      target = fill(target, elem);
    }
    return target;
  }